

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::AddModuleDefinitionFlag(cmMakefileTargetGenerator *this,string *flags)

{
  cmGeneratorTarget *this_00;
  cmMakefile *pcVar1;
  char *pcVar2;
  allocator local_82;
  allocator local_81;
  string flag;
  string local_60;
  string def;
  
  this_00 = this->GeneratorTarget;
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&local_60,"CMAKE_BUILD_TYPE",&local_81);
  pcVar2 = cmMakefile::GetSafeDefinition(pcVar1,&local_60);
  std::__cxx11::string::string((string *)&flag,pcVar2,&local_82);
  cmGeneratorTarget::GetModuleDefinitionFile(&def,this_00,&flag);
  std::__cxx11::string::~string((string *)&flag);
  std::__cxx11::string::~string((string *)&local_60);
  if (def._M_string_length != 0) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string((string *)&flag,"CMAKE_LINK_DEF_FILE_FLAG",(allocator *)&local_60);
    pcVar2 = cmMakefile::GetDefinition(pcVar1,&flag);
    std::__cxx11::string::~string((string *)&flag);
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::string((string *)&flag,pcVar2,(allocator *)&local_60);
      (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xe])
                (&local_60,this->LocalGenerator,&def,2);
      std::__cxx11::string::append((string *)&flag);
      std::__cxx11::string::~string((string *)&local_60);
      (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[5])
                (this->LocalGenerator,flags,&flag);
      std::__cxx11::string::~string((string *)&flag);
    }
  }
  std::__cxx11::string::~string((string *)&def);
  return;
}

Assistant:

void cmMakefileTargetGenerator::AddModuleDefinitionFlag(std::string& flags)
{
  std::string def = this->GeneratorTarget->GetModuleDefinitionFile(
                      this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
  if(def.empty())
    {
    return;
    }

  // TODO: Create a per-language flag variable.
  const char* defFileFlag =
    this->Makefile->GetDefinition("CMAKE_LINK_DEF_FILE_FLAG");
  if(!defFileFlag)
    {
    return;
    }

  // Append the flag and value.  Use ConvertToLinkReference to help
  // vs6's "cl -link" pass it to the linker.
  std::string flag = defFileFlag;
  flag += (this->LocalGenerator->ConvertToLinkReference(def));
  this->LocalGenerator->AppendFlags(flags, flag);
}